

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# role.c
# Opt level: O2

int str2role(char *str)

{
  char cVar1;
  char *__s2;
  int iVar2;
  size_t sVar3;
  Role *pRVar4;
  ulong uVar5;
  size_t __n;
  
  uVar5 = 0xffffffffffffffff;
  if ((str != (char *)0x0) && (cVar1 = *str, cVar1 != '\0')) {
    sVar3 = strlen(str);
    __n = (size_t)(int)sVar3;
    pRVar4 = roles;
    for (uVar5 = 0; uVar5 != 0xe; uVar5 = uVar5 + 1) {
      iVar2 = strncasecmp(str,(pRVar4->name).m,__n);
      if (iVar2 == 0) goto LAB_00225dc4;
      __s2 = (pRVar4->name).f;
      if (__s2 != (char *)0x0) {
        iVar2 = strncasecmp(str,__s2,__n);
        if (iVar2 == 0) goto LAB_00225dc4;
      }
      iVar2 = strncasecmp(str,pRVar4->filecode,0xffffffffffffffff);
      if (iVar2 == 0) goto LAB_00225dc4;
      pRVar4 = pRVar4 + 1;
    }
    if ((int)sVar3 == 1) {
      uVar5 = 0xfffffffffffffffe;
      if ((cVar1 == '*') || (cVar1 == '@')) goto LAB_00225dc4;
    }
    iVar2 = strncasecmp(str,"random",__n);
    uVar5 = (ulong)(-(uint)(iVar2 == 0) - 1);
  }
LAB_00225dc4:
  return (int)uVar5;
}

Assistant:

int str2role(char *str)
{
	int i, len;

	/* Is str valid? */
	if (!str || !str[0])
	    return ROLE_NONE;

	/* Match as much of str as is provided */
	len = strlen(str);
	for (i = 0; roles[i].name.m; i++) {
	    /* Does it match the male name? */
	    if (!strncmpi(str, roles[i].name.m, len))
		return i;
	    /* Or the female name? */
	    if (roles[i].name.f && !strncmpi(str, roles[i].name.f, len))
		return i;
	    /* Or the filecode? */
	    if (!strcmpi(str, roles[i].filecode))
		return i;
	}

	if ((len == 1 && (*str == '*' || *str == '@')) ||
		!strncmpi(str, randomstr, len))
	    return ROLE_RANDOM;

	/* Couldn't find anything appropriate */
	return ROLE_NONE;
}